

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[63],std::__cxx11::string_const&,char_const(&)[65],std::__cxx11::string_const&,char_const(&)[43]>
                   (string *__return_storage_ptr__,char (*a) [63],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [65],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [43])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_1c0;
  cmAlphaNum local_188;
  cmAlphaNum local_150;
  cmAlphaNum local_118;
  cmAlphaNum local_e0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a8;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  cmAlphaNum::cmAlphaNum(&local_e0,*a);
  local_a8.first = cmAlphaNum::View(&local_e0);
  local_a8.second = local_e0.RValueString_;
  local_118.RValueString_ = (string *)0x0;
  local_118.View_._M_str = (b->_M_dataplus)._M_p;
  local_118.View_._M_len = b->_M_string_length;
  local_90 = cmAlphaNum::View(&local_118);
  local_80 = local_118.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_150,*args);
  local_78 = cmAlphaNum::View(&local_150);
  local_68 = local_150.RValueString_;
  local_188.RValueString_ = (string *)0x0;
  local_188.View_._M_str = (args_1->_M_dataplus)._M_p;
  local_188.View_._M_len = args_1->_M_string_length;
  local_60 = cmAlphaNum::View(&local_188);
  local_50 = local_188.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_1c0,*args_2);
  local_48 = cmAlphaNum::View(&local_1c0);
  local_38 = local_1c0.RValueString_;
  views._M_len = 5;
  views._M_array = &local_a8;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}